

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

cmInstallRuntimeDependencySet * __thiscall
cmGlobalGenerator::GetNamedRuntimeDependencySet(cmGlobalGenerator *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Head_base<0UL,_cmInstallRuntimeDependencySet_*,_false> _Var3;
  iterator iVar4;
  cmInstallRuntimeDependencySet *this_00;
  pointer *__ptr;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>_>,_bool>
  pVar5;
  __single_object set;
  _Head_base<0UL,_cmInstallRuntimeDependencySet_*,_false> local_58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>
  local_50;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstallRuntimeDependencySet_*>_>_>
          ::find(&(this->RuntimeDependencySetsByName)._M_t,name);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this->RuntimeDependencySetsByName)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (cmInstallRuntimeDependencySet *)operator_new(0xa0);
    paVar1 = &local_50.first.field_2;
    pcVar2 = (name->_M_dataplus)._M_p;
    local_50.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
    cmInstallRuntimeDependencySet::cmInstallRuntimeDependencySet(this_00,&local_50.first);
    local_58._M_head_impl = this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.first._M_dataplus._M_p,
                      local_50.first.field_2._M_allocated_capacity + 1);
    }
    _Var3._M_head_impl = local_58._M_head_impl;
    pcVar2 = (name->_M_dataplus)._M_p;
    local_50.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
    local_50.second = _Var3._M_head_impl;
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmInstallRuntimeDependencySet*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmInstallRuntimeDependencySet*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmInstallRuntimeDependencySet*>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string,cmInstallRuntimeDependencySet*>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmInstallRuntimeDependencySet*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmInstallRuntimeDependencySet*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmInstallRuntimeDependencySet*>>>
                        *)&this->RuntimeDependencySetsByName,&local_50);
    iVar4._M_node = (_Base_ptr)pVar5.first._M_node;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.first._M_dataplus._M_p,
                      local_50.first.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>,std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>>>
    ::
    emplace_back<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>>
              ((vector<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>,std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>>>
                *)&this->RuntimeDependencySets,
               (unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>
                *)&local_58);
    if (local_58._M_head_impl != (cmInstallRuntimeDependencySet *)0x0) {
      std::default_delete<cmInstallRuntimeDependencySet>::operator()
                ((default_delete<cmInstallRuntimeDependencySet> *)&local_58,local_58._M_head_impl);
    }
  }
  return *(cmInstallRuntimeDependencySet **)(iVar4._M_node + 2);
}

Assistant:

cmInstallRuntimeDependencySet* cmGlobalGenerator::GetNamedRuntimeDependencySet(
  const std::string& name)
{
  auto it = this->RuntimeDependencySetsByName.find(name);
  if (it == this->RuntimeDependencySetsByName.end()) {
    auto set = cm::make_unique<cmInstallRuntimeDependencySet>(name);
    it =
      this->RuntimeDependencySetsByName.insert(std::make_pair(name, set.get()))
        .first;
    this->RuntimeDependencySets.push_back(std::move(set));
  }
  return it->second;
}